

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
make_input_array(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int N)

{
  result_type rVar1;
  size_type sVar2;
  reference pvVar3;
  result_type_conflict1 rVar4;
  ulong local_2748;
  size_t i;
  uniform_real_distribution<float> dis;
  undefined1 local_2728 [8];
  mt19937 gen;
  random_device rd;
  int N_local;
  vector<float,_std::allocator<float>_> *vf;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728,(ulong)rVar1);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)((long)&i + 4),-1.0,1.0);
  i._3_1_ = 0;
  std::allocator<float>::allocator((allocator<float> *)((long)&i + 2));
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(long)N,(allocator<float> *)((long)&i + 2));
  std::allocator<float>::~allocator((allocator<float> *)((long)&i + 2));
  for (local_2748 = 0;
      sVar2 = std::vector<float,_std::allocator<float>_>::size(__return_storage_ptr__),
      local_2748 < sVar2; local_2748 = local_2748 + 1) {
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)((long)&i + 4),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2728);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (__return_storage_ptr__,local_2748);
    *pvVar3 = rVar4;
  }
  i._3_1_ = 1;
  std::random_device::~random_device((random_device *)&gen._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> make_input_array(int N) {
  std::random_device rd;
  std::mt19937 gen(rd());
  std::uniform_real_distribution<float> dis(-1.0f, 1.0f);

  std::vector<float> vf(N);
  for (size_t i = 0; i < vf.size(); ++i) {
    vf[i] = dis(gen);
  }

  return vf;
}